

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<int,_4>::TPZManVector(TPZManVector<int,_4> *this,int64_t size,int *copy)

{
  int iVar1;
  undefined1 auVar2 [16];
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  TPZVec<int>::TPZVec(&this->super_TPZVec<int>,0);
  (this->super_TPZVec<int>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
  if (size < 5) {
    piVar3 = this->fExtAlloc;
    (this->super_TPZVec<int>).fStore = piVar3;
    (this->super_TPZVec<int>).fNElements = size;
    (this->super_TPZVec<int>).fNAlloc = 0;
    if (size < 1) {
      return;
    }
  }
  else {
    piVar3 = (int *)operator_new__(-(ulong)((ulong)size >> 0x3e != 0) | size * 4);
    (this->super_TPZVec<int>).fStore = piVar3;
    (this->super_TPZVec<int>).fNElements = size;
    (this->super_TPZVec<int>).fNAlloc = size;
  }
  auVar2 = _DAT_014d28c0;
  iVar1 = *copy;
  lVar4 = size + -1;
  auVar6._8_4_ = (int)lVar4;
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
  uVar5 = 0;
  auVar6 = auVar6 ^ _DAT_014d28c0;
  auVar8 = _DAT_014d2b10;
  auVar9 = _DAT_014d28b0;
  do {
    auVar10 = auVar9 ^ auVar2;
    iVar7 = auVar6._4_4_;
    if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_) &
              1)) {
      piVar3[uVar5] = iVar1;
    }
    if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
        auVar10._12_4_ <= auVar6._12_4_) {
      piVar3[uVar5 + 1] = iVar1;
    }
    auVar10 = auVar8 ^ auVar2;
    iVar11 = auVar10._4_4_;
    if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
      piVar3[uVar5 + 2] = iVar1;
      piVar3[uVar5 + 3] = iVar1;
    }
    uVar5 = uVar5 + 4;
    lVar4 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 4;
    auVar9._8_8_ = lVar4 + 4;
    lVar4 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 4;
    auVar8._8_8_ = lVar4 + 4;
  } while ((size + 3U & 0xfffffffffffffffc) != uVar5);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}